

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliasedOutline
          (EpsCopyOutputStream *this,uint32_t num,string_view s,uint8_t *ptr)

{
  ulong uVar1;
  uint8_t *puVar2;
  byte *pbVar3;
  uint uVar4;
  
  pbVar3 = this->end_;
  if (pbVar3 <= ptr) {
    ptr = EnsureSpaceFallback(this,ptr);
    pbVar3 = this->end_;
  }
  if (pbVar3 <= ptr) {
    WriteStringMaybeAliasedOutline((EpsCopyOutputStream *)&stack0xffffffffffffffd0);
  }
  uVar1 = (ulong)(num * 8 + 2);
  if (0x7f < num << 3) {
    do {
      uVar4 = (uint)uVar1;
      *ptr = (byte)uVar1 | 0x80;
      uVar1 = uVar1 >> 7;
      ptr = ptr + 1;
    } while (0x3fff < uVar4);
  }
  *ptr = (byte)uVar1;
  pbVar3 = ptr + 1;
  uVar1 = s._M_len & 0xffffffff;
  if (0x7f < (uint)s._M_len) {
    do {
      ptr = pbVar3;
      uVar4 = (uint)uVar1;
      *ptr = (byte)uVar1 | 0x80;
      uVar1 = uVar1 >> 7;
      pbVar3 = ptr + 1;
    } while (0x3fff < uVar4);
  }
  *pbVar3 = (byte)uVar1;
  puVar2 = WriteRawMaybeAliased(this,s._M_str,(uint)s._M_len,ptr + 2);
  return puVar2;
}

Assistant:

uint8_t* EpsCopyOutputStream::WriteStringMaybeAliasedOutline(
    uint32_t num, absl::string_view s, uint8_t* ptr) {
  ptr = EnsureSpace(ptr);
  uint32_t size = s.size();
  ptr = WriteLengthDelim(num, size, ptr);
  return WriteRawMaybeAliased(s.data(), size, ptr);
}